

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_NE_Test::Body(iu_SyntaxTest_x_iutest_x_NE_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, NE)
{
    if( int x = 1 )
        IUTEST_ASSERT_NE(0, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NE(0, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_NE(0, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NE(0, x) << x;
}